

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

int __thiscall
QPDFWriter::compareVersions(QPDFWriter *this,int major1,int minor1,int major2,int minor2)

{
  int minor2_local;
  int major2_local;
  int minor1_local;
  int major1_local;
  QPDFWriter *this_local;
  
  if (major1 < major2) {
    this_local._4_4_ = -1;
  }
  else if (major2 < major1) {
    this_local._4_4_ = 1;
  }
  else if (minor1 < minor2) {
    this_local._4_4_ = -1;
  }
  else if (minor2 < minor1) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int
QPDFWriter::compareVersions(int major1, int minor1, int major2, int minor2) const
{
    if (major1 < major2) {
        return -1;
    } else if (major1 > major2) {
        return 1;
    } else if (minor1 < minor2) {
        return -1;
    } else if (minor1 > minor2) {
        return 1;
    } else {
        return 0;
    }
}